

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryArticulatedSystemsLoader.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::LibraryArticulatedSystemsLoader::LibraryArticulatedSystemsLoader
          (LibraryArticulatedSystemsLoader *this,IFilePartLoader *callingFilePartLoader)

{
  undefined8 *in_RDI;
  IFilePartLoader *in_stack_ffffffffffffffc8;
  FilePartLoader *in_stack_ffffffffffffffd0;
  InstanceKinematicsModelLoader *this_00;
  
  FilePartLoader::FilePartLoader(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__LibraryArticulatedSystemsLoader_00e5afa8;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  this_00 = (InstanceKinematicsModelLoader *)(in_RDI + 8);
  std::__cxx11::string::string((string *)this_00);
  in_RDI[0xc] = 0;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  InstanceKinematicsModelLoader::InstanceKinematicsModelLoader(this_00);
  in_RDI[0x19] = 0;
  return;
}

Assistant:

LibraryArticulatedSystemsLoader::LibraryArticulatedSystemsLoader( IFilePartLoader* callingFilePartLoader )
		: FilePartLoader(callingFilePartLoader)
		, mCurrentKinematicsController(0)
		, mValueElementParentType(VALUE_ELEMENT_NONE)
		, mCurrentAxisInfo(0)
	{

	}